

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

pair<const_unsigned_char_*,_long>
duckdb_snappy::DecompressBranchless<char*>
          (uint8_t *ip,uint8_t *ip_limit,ptrdiff_t op,char *op_base,ptrdiff_t op_limit_min_slop)

{
  uint *puVar1;
  byte bVar2;
  short sVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int iVar14;
  size_t sVar15;
  ulong uVar16;
  long lVar17;
  uint *puVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  uint *puVar26;
  bool bVar27;
  pair<const_unsigned_char_*,_long> pVar28;
  uint *local_b0;
  ulong local_a8;
  size_t tag;
  undefined2 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  uint *local_88;
  long local_80;
  uint8_t safe_source [64];
  
  local_80 = op_limit_min_slop + -0x40;
  lVar17 = op;
  if (op < op_limit_min_slop + -0x40 && 0x82 < (long)ip_limit - (long)ip) {
    local_88 = (uint *)(ip_limit + -0x81);
    tag = (size_t)*ip;
    puVar18 = (uint *)safe_source;
    uVar23 = 0;
    local_b0 = (uint *)(ip + 1);
    do {
      for (uVar19 = 0; puVar26 = local_b0, uVar19 != 2; uVar19 = uVar19 + 1) {
        sVar3 = *(short *)((anonymous_namespace)::kLengthMinusOffset + tag * 2);
        uVar25 = (ulong)sVar3;
        sVar15 = AdvanceToNextTagX86Optimized((uint8_t **)&local_b0,&tag);
        uVar24 = uVar25 & 0xff;
        _local_98 = 0xffff00ff0000;
        uVar20 = (ulong)((uint)(ushort)(&local_98)[sVar15] & *puVar26);
        uVar16 = uVar25 - uVar20;
        if (uVar16 != 0 && (long)uVar20 <= (long)uVar25) {
          if (-1 < (char)sVar3) {
            uVar4 = *puVar18;
            uVar5 = puVar18[1];
            uVar6 = puVar18[2];
            uVar7 = puVar18[3];
            uVar8 = puVar18[5];
            uVar9 = puVar18[6];
            uVar10 = puVar18[7];
            puVar1 = (uint *)(op_base + op + 0x10);
            *puVar1 = puVar18[4];
            puVar1[1] = uVar8;
            puVar1[2] = uVar9;
            puVar1[3] = uVar10;
            puVar1 = (uint *)(op_base + op);
            *puVar1 = uVar4;
            puVar1[1] = uVar5;
            puVar1[2] = uVar6;
            puVar1[3] = uVar7;
            if (0x20 < uVar23) {
              uVar4 = puVar18[8];
              uVar5 = puVar18[9];
              uVar6 = puVar18[10];
              uVar7 = puVar18[0xb];
              uVar8 = puVar18[0xd];
              uVar9 = puVar18[0xe];
              uVar10 = puVar18[0xf];
              *(uint *)(op_base + op + 0x30) = puVar18[0xc];
              *(uint *)(op_base + op + 0x34) = uVar8;
              *(uint *)(op_base + op + 0x38) = uVar9;
              *(uint *)(op_base + op + 0x3c) = uVar10;
              *(uint *)(op_base + op + 0x20) = uVar4;
              *(uint *)(op_base + op + 0x24) = uVar5;
              *(uint *)(op_base + op + 0x28) = uVar6;
              *(uint *)(op_base + op + 0x2c) = uVar7;
            }
            lVar17 = uVar23 + op;
            if (-1 < (long)((lVar17 - uVar24) + uVar16)) {
              uVar22 = uVar24 - uVar16;
              if (uVar22 < 0x10) {
                if (uVar24 == uVar16) goto LAB_01e20319;
                for (lVar21 = 0; lVar21 != 0x10; lVar21 = lVar21 + 1) {
                  op_base[lVar21 + lVar17] =
                       op_base[lVar21 + (((uVar25 + lVar17) - uVar20) - uVar24)];
                }
                if (((anonymous_namespace)::Copy64BytesWithPatternExtension(char*,unsigned_long)::
                     pattern_sizes == '\0') &&
                   (local_a8 = uVar22,
                   iVar14 = __cxa_guard_acquire(&(anonymous_namespace)::
                                                 Copy64BytesWithPatternExtension(char*,unsigned_long)
                                                 ::pattern_sizes), uVar22 = local_a8, iVar14 != 0))
                {
                  for (lVar21 = 1; lVar21 != 0x10; lVar21 = lVar21 + 1) {
                    *(byte *)((long)&local_98 + lVar21) = (0x10 / (byte)lVar21 + 1) * (byte)lVar21;
                  }
                  (anonymous_namespace)::Copy64BytesWithPatternExtension(char*,unsigned_long)::
                  pattern_sizes._0_4_ = _local_98;
                  (anonymous_namespace)::Copy64BytesWithPatternExtension(char*,unsigned_long)::
                  pattern_sizes._4_4_ = uStack_94;
                  (anonymous_namespace)::Copy64BytesWithPatternExtension(char*,unsigned_long)::
                  pattern_sizes._8_4_ = uStack_90;
                  (anonymous_namespace)::Copy64BytesWithPatternExtension(char*,unsigned_long)::
                  pattern_sizes._12_4_ = uStack_8c;
                  __cxa_guard_release(&(anonymous_namespace)::
                                       Copy64BytesWithPatternExtension(char*,unsigned_long)::
                                       pattern_sizes);
                  uVar22 = local_a8;
                }
                bVar2 = (anonymous_namespace)::Copy64BytesWithPatternExtension(char*,unsigned_long)
                        ::pattern_sizes[uVar22];
                for (lVar21 = 0x10; lVar21 != 0x40; lVar21 = lVar21 + 0x10) {
                  uVar11 = *(undefined8 *)(op_base + lVar21 + ((uVar23 + op) - (ulong)bVar2) + 8);
                  *(undefined8 *)(op_base + lVar21 + lVar17) =
                       *(undefined8 *)(op_base + lVar21 + ((uVar23 + op) - (ulong)bVar2));
                  *(undefined8 *)(op_base + lVar21 + lVar17 + 8) = uVar11;
                }
              }
              else {
                for (lVar21 = 0; lVar21 != 0x40; lVar21 = lVar21 + 0x10) {
                  uVar11 = *(undefined8 *)
                            (op_base + lVar21 + (((uVar25 + lVar17) - uVar20) - uVar24) + 8);
                  *(undefined8 *)(op_base + lVar21 + lVar17) =
                       *(undefined8 *)(op_base + lVar21 + (((uVar25 + lVar17) - uVar20) - uVar24));
                  *(undefined8 *)(op_base + lVar21 + lVar17 + 8) = uVar11;
                }
              }
              lVar17 = uVar24 + lVar17;
              uVar23 = 0;
              puVar26 = (uint *)safe_source;
              goto LAB_01e200f6;
            }
LAB_01e20319:
            puVar18 = (uint *)safe_source;
            uVar23 = 0;
            op = lVar17;
          }
LAB_01e20309:
          bVar27 = 1 < uVar19;
          goto LAB_01e202ea;
        }
        lVar17 = uVar23 + op;
        lVar21 = (lVar17 - uVar24) + uVar16;
        if (lVar21 < 0) {
          if (sVar15 != 0) goto LAB_01e20309;
          uVar11 = *(undefined8 *)puVar18;
          uVar12 = *(undefined8 *)(puVar18 + 2);
          uVar13 = *(undefined8 *)(puVar18 + 6);
          *(undefined8 *)(op_base + op + 0x10) = *(undefined8 *)(puVar18 + 4);
          *(undefined8 *)(op_base + op + 0x10 + 8) = uVar13;
          *(undefined8 *)(op_base + op) = uVar11;
          *(undefined8 *)(op_base + op + 8) = uVar12;
          bVar27 = 0x20 < uVar23;
          uVar23 = uVar24;
          if (bVar27) {
            uVar11 = *(undefined8 *)(puVar18 + 8);
            uVar12 = *(undefined8 *)(puVar18 + 10);
            uVar13 = *(undefined8 *)(puVar18 + 0xe);
            *(undefined8 *)(op_base + op + 0x30) = *(undefined8 *)(puVar18 + 0xc);
            *(undefined8 *)(op_base + op + 0x38) = uVar13;
            *(undefined8 *)(op_base + op + 0x20) = uVar11;
            *(undefined8 *)(op_base + op + 0x28) = uVar12;
          }
        }
        else {
          if (sVar15 != 0) {
            puVar26 = (uint *)(op_base + lVar21);
          }
          uVar11 = *(undefined8 *)puVar18;
          uVar12 = *(undefined8 *)(puVar18 + 2);
          uVar13 = *(undefined8 *)(puVar18 + 6);
          *(undefined8 *)(op_base + op + 0x10) = *(undefined8 *)(puVar18 + 4);
          *(undefined8 *)(op_base + op + 0x10 + 8) = uVar13;
          *(undefined8 *)(op_base + op) = uVar11;
          *(undefined8 *)(op_base + op + 8) = uVar12;
          bVar27 = 0x20 < uVar23;
          uVar23 = uVar24;
          if (bVar27) {
            uVar11 = *(undefined8 *)(puVar18 + 8);
            uVar12 = *(undefined8 *)(puVar18 + 10);
            uVar13 = *(undefined8 *)(puVar18 + 0xe);
            *(undefined8 *)(op_base + op + 0x30) = *(undefined8 *)(puVar18 + 0xc);
            *(undefined8 *)(op_base + op + 0x38) = uVar13;
            *(undefined8 *)(op_base + op + 0x20) = uVar11;
            *(undefined8 *)(op_base + op + 0x28) = uVar12;
          }
        }
LAB_01e200f6:
        puVar18 = puVar26;
        op = lVar17;
      }
      bVar27 = true;
LAB_01e202ea:
      lVar21 = uVar23 + op;
    } while (((bVar27) && (puVar26 < local_88)) && (local_b0 = puVar26, lVar21 < local_80));
    ip = (uint8_t *)((long)puVar26 + -1);
    lVar17 = op;
    if (uVar23 != 0) {
      uVar11 = *(undefined8 *)puVar18;
      uVar12 = *(undefined8 *)(puVar18 + 2);
      uVar13 = *(undefined8 *)(puVar18 + 6);
      *(undefined8 *)(op_base + op + 0x10) = *(undefined8 *)(puVar18 + 4);
      *(undefined8 *)(op_base + op + 0x10 + 8) = uVar13;
      *(undefined8 *)(op_base + op) = uVar11;
      *(undefined8 *)(op_base + op + 8) = uVar12;
      lVar17 = lVar21;
      if (0x20 < uVar23) {
        uVar11 = *(undefined8 *)(puVar18 + 8);
        uVar12 = *(undefined8 *)(puVar18 + 10);
        uVar13 = *(undefined8 *)(puVar18 + 0xe);
        *(undefined8 *)(op_base + op + 0x30) = *(undefined8 *)(puVar18 + 0xc);
        *(undefined8 *)(op_base + op + 0x38) = uVar13;
        *(undefined8 *)(op_base + op + 0x20) = uVar11;
        *(undefined8 *)(op_base + op + 0x28) = uVar12;
      }
    }
  }
  pVar28.second = lVar17;
  pVar28.first = ip;
  return pVar28;
}

Assistant:

std::pair<const uint8_t*, ptrdiff_t> DecompressBranchless(
    const uint8_t* ip, const uint8_t* ip_limit, ptrdiff_t op, T op_base,
    ptrdiff_t op_limit_min_slop) {
  // If deferred_src is invalid point it here.
  uint8_t safe_source[64];
  const void* deferred_src;
  size_t deferred_length;
  ClearDeferred(&deferred_src, &deferred_length, safe_source);

  // We unroll the inner loop twice so we need twice the spare room.
  op_limit_min_slop -= kSlopBytes;
  if (2 * (kSlopBytes + 1) < ip_limit - ip && op < op_limit_min_slop) {
    const uint8_t* const ip_limit_min_slop = ip_limit - 2 * kSlopBytes - 1;
    ip++;
    // ip points just past the tag and we are touching at maximum kSlopBytes
    // in an iteration.
    size_t tag = ip[-1];
#if defined(__clang__) && defined(__aarch64__)
    // Workaround for https://bugs.llvm.org/show_bug.cgi?id=51317
    // when loading 1 byte, clang for aarch64 doesn't realize that it(ldrb)
    // comes with free zero-extension, so clang generates another
    // 'and xn, xm, 0xff' before it use that as the offset. This 'and' is
    // redundant and can be removed by adding this dummy asm, which gives
    // clang a hint that we're doing the zero-extension at the load.
    asm("" ::"r"(tag));
#endif
    do {
      // The throughput is limited by instructions, unrolling the inner loop
      // twice reduces the amount of instructions checking limits and also
      // leads to reduced mov's.

      SNAPPY_PREFETCH(ip + 128);
      for (int i = 0; i < 2; i++) {
        const uint8_t* old_ip = ip;
        assert(tag == ip[-1]);
        // For literals tag_type = 0, hence we will always obtain 0 from
        // ExtractLowBytes. For literals offset will thus be kLiteralOffset.
        ptrdiff_t len_minus_offset = kLengthMinusOffset[tag];
        uint32_t next;
#if defined(__aarch64__)
        size_t tag_type = AdvanceToNextTagARMOptimized(&ip, &tag);
        // We never need more than 16 bits. Doing a Load16 allows the compiler
        // to elide the masking operation in ExtractOffset.
        next = LittleEndian::Load16(old_ip);
#else
        size_t tag_type = AdvanceToNextTagX86Optimized(&ip, &tag);
        next = LittleEndian::Load32(old_ip);
#endif
        size_t len = len_minus_offset & 0xFF;
        ptrdiff_t extracted = ExtractOffset(next, tag_type);
        ptrdiff_t len_min_offset = len_minus_offset - extracted;
        if (SNAPPY_PREDICT_FALSE(len_minus_offset > extracted)) {
          if (SNAPPY_PREDICT_FALSE(len & 0x80)) {
            // Exceptional case (long literal or copy 4).
            // Actually doing the copy here is negatively impacting the main
            // loop due to compiler incorrectly allocating a register for
            // this fallback. Hence we just break.
          break_loop:
            ip = old_ip;
            goto exit;
          }
          // Only copy-1 or copy-2 tags can get here.
          assert(tag_type == 1 || tag_type == 2);
          std::ptrdiff_t delta = (op + deferred_length) + len_min_offset - len;
          // Guard against copies before the buffer start.
          // Execute any deferred MemCopy since we write to dst here.
          MemCopy64(op_base + op, deferred_src, deferred_length);
          op += deferred_length;
          ClearDeferred(&deferred_src, &deferred_length, safe_source);
          if (SNAPPY_PREDICT_FALSE(delta < 0 ||
                                  !Copy64BytesWithPatternExtension(
                                      op_base + op, len - len_min_offset))) {
            goto break_loop;
          }
          // We aren't deferring this copy so add length right away.
          op += len;
          continue;
        }
        std::ptrdiff_t delta = (op + deferred_length) + len_min_offset - len;
        if (SNAPPY_PREDICT_FALSE(delta < 0)) {
          // Due to the spurious offset in literals have this will trigger
          // at the start of a block when op is still smaller than 256.
          if (tag_type != 0) goto break_loop;
          MemCopy64(op_base + op, deferred_src, deferred_length);
          op += deferred_length;
          DeferMemCopy(&deferred_src, &deferred_length, old_ip, len);
          continue;
        }

        // For copies we need to copy from op_base + delta, for literals
        // we need to copy from ip instead of from the stream.
        const void* from =
            tag_type ? reinterpret_cast<void*>(op_base + delta) : old_ip;
        MemCopy64(op_base + op, deferred_src, deferred_length);
        op += deferred_length;
        DeferMemCopy(&deferred_src, &deferred_length, from, len);
      }
    } while (ip < ip_limit_min_slop &&
             static_cast<ptrdiff_t>(op + deferred_length) < op_limit_min_slop);
  exit:
    ip--;
    assert(ip <= ip_limit);
  }
  // If we deferred a copy then we can perform.  If we are up to date then we
  // might not have enough slop bytes and could run past the end.
  if (deferred_length) {
    MemCopy64(op_base + op, deferred_src, deferred_length);
    op += deferred_length;
    ClearDeferred(&deferred_src, &deferred_length, safe_source);
  }
  return {ip, op};
}